

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmerr.cpp
# Opt level: O1

int err_load_message_file
              (osfildef *fp,err_msg_t **arr,size_t *arr_size,err_msg_t *default_arr,
              size_t default_arr_size)

{
  size_t sVar1;
  size_t sVar2;
  err_msg_t *__s;
  char *__ptr;
  char *pcVar3;
  ulong __size;
  ulong __size_00;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  char buf [128];
  undefined4 local_b8;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  char cStack_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  
  sVar2 = fread(&local_b8,0x16,1,(FILE *)fp);
  if (sVar2 == 1) {
    auVar6[0] = -((char)uStack_b2 == 'M');
    auVar6[1] = -(uStack_b2._1_1_ == 'e');
    auVar6[2] = -(cStack_b0 == 's');
    auVar6[3] = -(cStack_af == 's');
    auVar6[4] = -(cStack_ae == 'a');
    auVar6[5] = -(cStack_ad == 'g');
    auVar6[6] = -(cStack_ac == 'e');
    auVar6[7] = -(cStack_ab == '.');
    auVar6[8] = -(cStack_aa == '0');
    auVar6[9] = -(cStack_a9 == '0');
    auVar6[10] = -(cStack_a8 == '0');
    auVar6[0xb] = -(cStack_a7 == '1');
    auVar6[0xc] = -(cStack_a6 == '\n');
    auVar6[0xd] = -(cStack_a5 == '\r');
    auVar6[0xe] = -(cStack_a4 == '\x1a');
    auVar6[0xf] = -(cStack_a3 == '\0');
    auVar5[0] = -((char)local_b8 == 'T');
    auVar5[1] = -(local_b8._1_1_ == 'A');
    auVar5[2] = -(local_b8._2_1_ == 'D');
    auVar5[3] = -(local_b8._3_1_ == 'S');
    auVar5[4] = -((char)uStack_b4 == '3');
    auVar5[5] = -(uStack_b4._1_1_ == '.');
    auVar5[6] = -((char)uStack_b2 == 'M');
    auVar5[7] = -(uStack_b2._1_1_ == 'e');
    auVar5[8] = -(cStack_b0 == 's');
    auVar5[9] = -(cStack_af == 's');
    auVar5[10] = -(cStack_ae == 'a');
    auVar5[0xb] = -(cStack_ad == 'g');
    auVar5[0xc] = -(cStack_ac == 'e');
    auVar5[0xd] = -(cStack_ab == '.');
    auVar5[0xe] = -(cStack_aa == '0');
    auVar5[0xf] = -(cStack_a9 == '0');
    auVar5 = auVar5 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
      err_delete_message_array(arr,arr_size,default_arr,default_arr_size);
      sVar2 = fread(&local_b8,2,1,(FILE *)fp);
      if (sVar2 == 1) {
        *arr_size = (ulong)(ushort)local_b8;
        __s = (err_msg_t *)malloc((ulong)(ushort)local_b8 * 0x18);
        *arr = __s;
        if (__s != (err_msg_t *)0x0) {
          sVar1 = *arr_size;
          memset(__s,0,sVar1 * 0x18);
          if (sVar1 == 0) {
            return 0;
          }
          uVar4 = 0;
          while (sVar2 = fread(&local_b8,8,1,(FILE *)fp), sVar2 == 1) {
            __s->msgnum = local_b8;
            __size = (ulong)uStack_b4;
            __size_00 = (ulong)uStack_b2;
            __ptr = (char *)malloc(__size + 1);
            __s->short_msgtxt = __ptr;
            pcVar3 = (char *)malloc(__size_00 + 1);
            __s->long_msgtxt = pcVar3;
            if ((((__ptr == (char *)0x0) || (pcVar3 == (char *)0x0)) ||
                (sVar2 = fread(__ptr,__size,1,(FILE *)fp), sVar2 != 1)) ||
               (sVar2 = fread(__s->long_msgtxt,__size_00,1,(FILE *)fp), sVar2 != 1)) break;
            __s->short_msgtxt[__size] = '\0';
            __s->long_msgtxt[__size_00] = '\0';
            uVar4 = uVar4 + 1;
            __s = __s + 1;
            if (*arr_size <= uVar4) {
              return 0;
            }
          }
        }
      }
    }
  }
  err_delete_message_array(arr,arr_size,default_arr,default_arr_size);
  return 1;
}

Assistant:

int err_load_message_file(osfildef *fp,
                          const err_msg_t **arr, size_t *arr_size,
                          const err_msg_t *default_arr,
                          size_t default_arr_size)
{
    char buf[128];
    size_t i;
    err_msg_t *msg;
    
    /* read the file signature */
    if (osfrb(fp, buf, sizeof(VM_MESSAGE_FILE_SIGNATURE))
        || memcmp(buf, VM_MESSAGE_FILE_SIGNATURE,
                  sizeof(VM_MESSAGE_FILE_SIGNATURE)) != 0)
        goto fail;

    /* delete any previously-loaded message array */
    err_delete_message_array(arr, arr_size, default_arr, default_arr_size);

    /* read the message count */
    if (osfrb(fp, buf, 2))
        goto fail;

    /* set the new message count */
    *arr_size = osrp2(buf);

    /* allocate the message array */
    *arr = (err_msg_t *)t3malloc(*arr_size * sizeof(err_msg_t));
    if (*arr == 0)
        goto fail;

    /* clear the memory */
    memset((err_msg_t *)*arr, 0, *arr_size * sizeof(err_msg_t));

    /* read the individual messages */
    for (i = 0, msg = (err_msg_t *)*arr ; i < *arr_size ; ++i, ++msg)
    {
        size_t len1, len2;
        
        /* read the current message ID and the length of the two messages */
        if (osfrb(fp, buf, 8))
            goto fail;

        /* set the message ID */
        msg->msgnum = (int)t3rp4u(buf);

        /* get the short and long mesage lengths */
        len1 = osrp2(buf + 4);
        len2 = osrp2(buf + 6);

        /* allocate buffers */
        msg->short_msgtxt = (char *)t3malloc(len1 + 1);
        msg->long_msgtxt = (char *)t3malloc(len2 + 1);

        /* if either one failed, give up */
        if (msg->short_msgtxt == 0 || msg->long_msgtxt == 0)
            goto fail;

        /* read the two messages */
        if (osfrb(fp, (char *)msg->short_msgtxt, len1)
            || osfrb(fp, (char *)msg->long_msgtxt, len2))
            goto fail;

        /* null-terminate the strings */
        *(char *)(msg->short_msgtxt + len1) = '\0';
        *(char *)(msg->long_msgtxt + len2) = '\0';
    }

    /* success */
    return 0;

fail:
    /* revert back to the built-in array */
    err_delete_message_array(arr, arr_size,
                             default_arr, default_arr_size);

    /* indicate failure */
    return 1;
}